

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_entry_extract(zip_t *zip,
                     _func_size_t_void_ptr_unsigned_long_long_void_ptr_size_t *on_extract,void *arg)

{
  mz_uint file_index;
  mz_bool mVar1;
  int iVar2;
  
  iVar2 = -1;
  if (((zip != (zip_t *)0x0) && ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING)) &&
     (file_index = (zip->entry).index, -1 < (int)file_index)) {
    mVar1 = mz_zip_reader_extract_to_callback
                      (&zip->archive,file_index,(mz_file_write_func)on_extract,arg,0);
    iVar2 = mVar1 + -1;
  }
  return iVar2;
}

Assistant:

int zip_entry_extract(struct zip_t *zip,
                      size_t (*on_extract)(void *arg, unsigned long long offset,
                                           const void *buf, size_t bufsize),
                      void *arg) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING || zip->entry.index < 0) {
    // the entry is not found or we do not have read access
    return -1;
  }

  idx = (mz_uint)zip->entry.index;
  return (mz_zip_reader_extract_to_callback(pzip, idx, on_extract, arg, 0))
             ? 0
             : -1;
}